

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__fs_scandir_cleanup(uv_fs_t *req)

{
  void *pvVar1;
  ssize_t sVar2;
  uint *puVar3;
  uint local_24;
  uint n;
  uint i;
  uint *nbufs;
  uv__dirent_t **dents;
  uv_fs_t *req_local;
  
  if (-1 < req->result) {
    pvVar1 = req->ptr;
    puVar3 = uv__get_nbufs(req);
    local_24 = 0;
    if (*puVar3 != 0) {
      local_24 = *puVar3 - 1;
    }
    sVar2 = req->result;
    for (; local_24 < (uint)sVar2; local_24 = local_24 + 1) {
      free(*(void **)((long)pvVar1 + (ulong)local_24 * 8));
    }
  }
  free(req->ptr);
  req->ptr = (void *)0x0;
  return;
}

Assistant:

void uv__fs_scandir_cleanup(uv_fs_t* req) {
  uv__dirent_t** dents;
  unsigned int* nbufs;
  unsigned int i;
  unsigned int n;

  if (req->result >= 0) {
    dents = req->ptr;
    nbufs = uv__get_nbufs(req);

    i = 0;
    if (*nbufs > 0)
      i = *nbufs - 1;

    n = (unsigned int) req->result;
    for (; i < n; i++)
      uv__fs_scandir_free(dents[i]);
  }

  uv__fs_scandir_free(req->ptr);
  req->ptr = NULL;
}